

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O1

void list_set_and_clear(Am_Object *inter,Am_Object *old_object,Am_Object *new_object,
                       Am_Object *ref_object)

{
  bool bVar1;
  Am_Value *pAVar2;
  int iVar3;
  Am_Object current;
  Am_Value_List all_objects;
  int stopErase;
  int startErase;
  int stopSet;
  int startSet;
  Am_Object local_50;
  Am_Value_List local_48;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)inter,10);
  pAVar2 = Am_Object::Get(&local_50,0x82,0);
  Am_Value_List::Am_Value_List(&local_48,pAVar2);
  Am_Object::~Am_Object(&local_50);
  local_50.data = (Am_Object_Data *)0x0;
  calc_ranks(&local_2c,&local_30,&local_34,&local_38,old_object,new_object,ref_object);
  if (local_34 != -1) {
    Am_Value_List::Start(&local_48);
    if (local_34 < 1) {
      local_34 = 0;
    }
    else {
      iVar3 = local_34;
      do {
        Am_Value_List::Next(&local_48);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    if (local_34 <= local_38) {
      iVar3 = (local_38 - local_34) + 1;
      do {
        pAVar2 = Am_Value_List::Get(&local_48);
        Am_Object::operator=(&local_50,pAVar2);
        Am_Object::Set(&local_50,0x172,false,1);
        Am_Value_List::Next(&local_48);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  if (local_2c != -1) {
    Am_Value_List::Start(&local_48);
    if (local_2c < 1) {
      local_2c = 0;
    }
    else {
      iVar3 = local_2c;
      do {
        Am_Value_List::Next(&local_48);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    if (local_2c <= local_30) {
      iVar3 = (local_30 - local_2c) + 1;
      do {
        pAVar2 = Am_Value_List::Get(&local_48);
        Am_Object::operator=(&local_50,pAVar2);
        pAVar2 = Am_Object::Get(&local_50,0xcc,0);
        bVar1 = Am_Value::Valid(pAVar2);
        if (bVar1) {
          Am_Object::Set(&local_50,0x172,true,1);
        }
        Am_Value_List::Next(&local_48);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(&local_48);
  return;
}

Assistant:

void
list_set_and_clear(Am_Object &inter, Am_Object &old_object,
                   Am_Object &new_object, Am_Object &ref_object)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, old_object, new_object,
             ref_object);
  if (startErase != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startErase; all_objects.Next(), i++)
      ;
    for (; i <= stopErase; all_objects.Next(), i++) {
      current = all_objects.Get();
      Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
      current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  }
  if (startSet != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startSet; all_objects.Next(), i++)
      ;
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, true);
        current.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    }
  }
}